

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool run_container_is_subset_array(run_container_t *container1,array_container_t *container2)

{
  ushort min;
  ushort uVar1;
  int length;
  uint16_t *array;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int32_t iVar5;
  int32_t pos;
  ulong uVar6;
  uint16_t local_58;
  _Bool local_48;
  
  iVar3 = run_container_cardinality(container1);
  length = container2->cardinality;
  local_48 = false;
  if (iVar3 <= length) {
    uVar2 = container1->n_runs;
    if (container1->n_runs < 1) {
      uVar2 = 0;
    }
    pos = -1;
    uVar6 = 0;
    while (local_48 = uVar2 == uVar6, !local_48) {
      min = container1->runs[uVar6].value;
      uVar1 = container1->runs[uVar6].length;
      uVar4 = (uint)uVar1 + (uint)min;
      array = container2->array;
      iVar5 = advanceUntil(array,pos,length,min);
      local_58 = (uint16_t)uVar4;
      pos = advanceUntil(array,pos,length,local_58);
      if (pos == length) {
        return local_48;
      }
      if (pos - iVar5 != (uint)uVar1) {
        return local_48;
      }
      if (array[iVar5] != min) {
        return local_48;
      }
      uVar6 = uVar6 + 1;
      if (uVar4 != array[pos]) {
        return local_48;
      }
    }
  }
  return local_48;
}

Assistant:

bool run_container_is_subset_array(const run_container_t* container1,
                                   const array_container_t* container2) {
    if (run_container_cardinality(container1) > container2->cardinality)
        return false;
    int32_t start_pos = -1, stop_pos = -1;
    for (int i = 0; i < container1->n_runs; ++i) {
        int32_t start = container1->runs[i].value;
        int32_t stop = start + container1->runs[i].length;
        start_pos = advanceUntil(container2->array, stop_pos,
                                 container2->cardinality, start);
        stop_pos = advanceUntil(container2->array, stop_pos,
                                container2->cardinality, stop);
        if (stop_pos == container2->cardinality) {
            return false;
        } else if (stop_pos - start_pos != stop - start ||
                   container2->array[start_pos] != start ||
                   container2->array[stop_pos] != stop) {
            return false;
        }
    }
    return true;
}